

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int urltype2driver(char *urltype,int *driver)

{
  int iVar1;
  int *in_RSI;
  char *in_RDI;
  int ii;
  int local_1c;
  
  local_1c = no_of_drivers + -1;
  while( true ) {
    if (local_1c < 0) {
      return 0x7c;
    }
    iVar1 = strcmp(driverTable[local_1c].prefix,in_RDI);
    if (iVar1 == 0) break;
    local_1c = local_1c + -1;
  }
  *in_RSI = local_1c;
  return 0;
}

Assistant:

int urltype2driver(char *urltype, int *driver)
/*
   compare input URL with list of known drivers, returning the
   matching driver numberL.
*/

{ 
    int ii;

       /* find matching driver; search most recent drivers first */

    for (ii=no_of_drivers - 1; ii >= 0; ii--)
    {
        if (0 == strcmp(driverTable[ii].prefix, urltype))
        { 
             *driver = ii;
             return(0);
        }
    }

    return(NO_MATCHING_DRIVER);   
}